

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint *psVar1;
  byte bVar2;
  sqlite3_index_constraint *psVar3;
  sqlite3_index_constraint_usage *psVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  char *__dest;
  uchar uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 uVar13;
  int iVar14;
  long in_FS_OFFSET;
  char zIdxStr [41];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined1 uStack_50;
  undefined7 local_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4f = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  uVar8 = (ulong)pIdxInfo->nConstraint;
  if ((long)uVar8 < 1) {
    bVar5 = true;
  }
  else {
    lVar10 = 0;
    bVar5 = false;
    do {
      if ((&pIdxInfo->aConstraint->op)[lVar10] == '@') {
        bVar5 = true;
      }
      lVar10 = lVar10 + 0xc;
    } while (uVar8 * 0xc != lVar10);
    bVar5 = !bVar5;
  }
  if (pIdxInfo->nConstraint < 1) {
    iVar14 = 0;
  }
  else {
    psVar3 = pIdxInfo->aConstraint;
    uVar11 = 0;
    iVar14 = 0;
    do {
      psVar1 = psVar3 + uVar11;
      if ((((bVar5) && (psVar1->usable != '\0')) && (psVar1->iColumn < 1)) && (psVar1->op == '\x02')
         ) {
        if (uVar11 == 0) {
          uVar12 = 0;
        }
        else {
          psVar4 = pIdxInfo->aConstraintUsage;
          uVar12 = 0;
          do {
            psVar4[uVar12].argvIndex = 0;
            psVar4[uVar12].omit = '\0';
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        pIdxInfo->idxNum = 1;
        psVar4 = pIdxInfo->aConstraintUsage;
        psVar4[uVar11].argvIndex = 1;
        psVar4[uVar12].omit = '\x01';
        pIdxInfo->estimatedCost = 30.0;
        pIdxInfo->estimatedRows = 1;
        pIdxInfo->idxFlags = 1;
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if ((psVar1->usable != '\0') &&
           (((0 < psVar1->iColumn && (psVar1->iColumn <= (int)(uint)(byte)tab[1].field_0xd)) ||
            (psVar1->op == '@')))) {
          bVar2 = psVar1->op;
          if (bVar2 < 0x10) {
            if (bVar2 == 2) {
              uVar13 = 0x41;
            }
            else {
              if (bVar2 != 4) {
                if (bVar2 == 8) {
                  uVar13 = 0x42;
                  goto LAB_001f8745;
                }
LAB_001f872a:
                bVar6 = true;
                uVar13 = 0;
                uVar9 = '\x01';
                goto LAB_001f8748;
              }
              uVar13 = 0x45;
            }
LAB_001f8738:
            bVar6 = false;
            uVar9 = '\0';
          }
          else {
            if (bVar2 == 0x10) {
              uVar13 = 0x43;
              goto LAB_001f8738;
            }
            if (bVar2 == 0x20) {
              uVar13 = 0x44;
            }
            else {
              if (bVar2 != 0x40) goto LAB_001f872a;
              uVar13 = 0x46;
            }
LAB_001f8745:
            uVar9 = '\x01';
            bVar6 = false;
          }
LAB_001f8748:
          if (!bVar6) {
            *(undefined1 *)((long)&local_68 + (long)iVar14) = uVar13;
            *(char *)((long)&local_68 + (long)iVar14 + 1) = (char)psVar1->iColumn + '/';
            psVar4 = pIdxInfo->aConstraintUsage;
            psVar4[uVar11].argvIndex = (iVar14 - (iVar14 + 2 >> 0x1f)) + 2 >> 1;
            psVar4[uVar11].omit = uVar9;
            iVar14 = iVar14 + 2;
          }
        }
      }
      if (!bVar7) goto LAB_001f8826;
      uVar11 = uVar11 + 1;
    } while ((uVar11 < uVar8) && (iVar14 < 0x28));
  }
  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if (0 < iVar14) {
    __dest = (char *)sqlite3_malloc(iVar14 + 1U);
    pIdxInfo->idxStr = __dest;
    if (__dest == (char *)0x0) {
      iVar14 = 7;
      goto LAB_001f8828;
    }
    memcpy(__dest,&local_68,(ulong)(iVar14 + 1U));
  }
  lVar10 = *(long *)&tab[3].nRef >> ((byte)((uint)(iVar14 - (iVar14 >> 0x1f)) >> 1) & 0x3f);
  pIdxInfo->estimatedCost = (double)lVar10 * 6.0;
  pIdxInfo->estimatedRows = lVar10;
LAB_001f8826:
  iVar14 = 0;
LAB_001f8828:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar14;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable
     && p->iColumn<=0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be
      ** considered almost as quick as a direct rowid lookup (for which
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      u8 doOmit = 1;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = doOmit;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 ){
    pIdxInfo->idxStr = sqlite3_malloc( iIdx+1 );
    if( pIdxInfo->idxStr==0 ){
      return SQLITE_NOMEM;
    }
    memcpy(pIdxInfo->idxStr, zIdxStr, iIdx+1);
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}